

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::try_to_store_message_to_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
           *this,type_index *msg_type,message_ref_t *message,invocation_type_t demand_type)

{
  overflow_reaction_t oVar1;
  long lVar2;
  anon_class_24_3_b3d561ce lambda;
  long lVar3;
  anon_class_16_2_f638b178 __p;
  bool queue_full;
  deliver_op_tracer tracer;
  unique_lock<std::mutex> lock;
  type_index *in_stack_ffffffffffffff90;
  bool local_62;
  deliver_op_tracer local_61;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
  *pmStack_58;
  type_index *local_50 [2];
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->m_lock;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  if (this->m_status == closed) goto LAB_00212484;
  local_62 = (this->m_queue).m_max_size == (this->m_queue).m_size;
  if (local_62) {
    lVar2 = (this->m_capacity).m_overflow_timeout.__r;
    if (lVar2 != 0) {
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_60.__d.__r = (duration)(lVar3 + lVar2);
      __p.queue_full = &local_62;
      __p.this = this;
      std::condition_variable::
      wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                (&this->m_overflow_cond,&local_40,&local_60,__p);
      if ((local_62 & 1U) == 0) goto LAB_0021246e;
    }
    oVar1 = (this->m_capacity).m_overflow_reaction;
    if (oVar1 == throw_exception) {
      local_60.__d.__r = (duration)(duration)local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "an attempt to push message to full mchain with overflow_reaction_t::throw_exception policy"
                 ,"");
      exception_t::raise(0x248f28);
      if (local_60.__d.__r != (duration)local_50) {
        operator_delete((void *)local_60.__d.__r);
      }
    }
    else {
      if (oVar1 == drop_newest) goto LAB_00212484;
      if (oVar1 != remove_oldest) {
        local_60.__d.__r = (duration)&local_61;
        lambda.this = (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
                       *)msg_type;
        lambda.tracer = (deliver_op_tracer *)this;
        lambda.msg_type = in_stack_ffffffffffffff90;
        pmStack_58 = this;
        local_50[0] = msg_type;
        so_5::details::
        invoke_noexcept_code<so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>::try_to_store_message_to_queue(std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_2_>
                  (lambda);
        abort();
      }
      details::
      ensure_queue_not_empty<so_5::mchain_props::details::limited_preallocated_demand_queue&>
                (&this->m_queue);
      details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
    }
  }
LAB_0021246e:
  complete_store_message_to_queue(this,&local_61,msg_type,message,demand_type);
LAB_00212484:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void
		try_to_store_message_to_queue(
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				typename TRACING_BASE::deliver_op_tracer tracer{
						*this, // as tracing base.
						*this, // as chain.
						msg_type,
						message,
						demand_type };

				std::unique_lock< std::mutex > lock{ m_lock };

				// Message cannot be stored to closed chain.
				if( details::status::closed == m_status )
					return;

				// If queue full and waiting on full queue is enabled we
				// must wait for some time until there will be some space in
				// the queue.
				bool queue_full = m_queue.is_full();
				if( queue_full && m_capacity.is_overflow_timeout_defined() )
					{
						m_overflow_cond.wait_for(
								lock,
								m_capacity.overflow_timeout(),
								[this, &queue_full] {
									queue_full = m_queue.is_full();
									return !queue_full ||
											details::status::closed == m_status;
								} );
					}

				// If queue still full we must perform some reaction.
				if( queue_full )
					{
						const auto reaction = m_capacity.overflow_reaction();
						if( overflow_reaction_t::drop_newest == reaction )
							{
								// New message must be simply ignored.
								tracer.overflow_drop_newest();
								return;
							}
						else if( overflow_reaction_t::remove_oldest == reaction )
							{
								// The oldest message must be simply removed.
								tracer.overflow_remove_oldest( m_queue.front() );
								m_queue.pop_front();
							}
						else if( overflow_reaction_t::throw_exception == reaction )
							{
								tracer.overflow_throw_exception();
								SO_5_THROW_EXCEPTION(
										rc_msg_chain_overflow,
										"an attempt to push message to full mchain "
										"with overflow_reaction_t::throw_exception policy" );
							}
						else
							{
								so_5::details::abort_on_fatal_error( [&] {
										tracer.overflow_throw_exception();
										SO_5_LOG_ERROR( m_env, log_stream ) {
											log_stream << "overflow_reaction_t::abort_app "
													"will be performed for mchain (id="
													<< m_id << "), msg_type: "
													<< msg_type.name()
													<< ". Application will be aborted"
													<< std::endl;
										}
									} );
							}
					}

				complete_store_message_to_queue(
						tracer,
						msg_type,
						message,
						demand_type );
			}